

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall pbrt::Image::Bilerp(Image *this,Point2f p,WrapMode2D wrapMode)

{
  int iVar1;
  size_t in_RSI;
  ImageChannelValues *in_RDI;
  Float FVar2;
  undefined1 in_ZMM0 [64];
  int c;
  ImageChannelValues *cv;
  reference in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  ImageChannelValues *this_00;
  undefined4 local_28;
  
  vmovlpd_avx(in_ZMM0._0_16_);
  this_00 = in_RDI;
  NChannels((Image *)0x5553fa);
  ImageChannelValues::ImageChannelValues(this_00,in_RSI,(Float)((ulong)in_RDI >> 0x20));
  local_28 = 0;
  while( true ) {
    iVar1 = NChannels((Image *)0x555425);
    if (iVar1 <= local_28) break;
    FVar2 = BilerpChannel((Image *)wrapMode.wrap.values,(Point2f)cv,this._4_4_,
                          (WrapMode2D)p.super_Tuple2<pbrt::Point2,_float>);
    in_stack_ffffffffffffff88 =
         InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                    CONCAT44(FVar2,in_stack_ffffffffffffff90),(size_type)in_stack_ffffffffffffff88);
    *in_stack_ffffffffffffff88 = FVar2;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

ImageChannelValues Image::Bilerp(Point2f p, WrapMode2D wrapMode) const {
    ImageChannelValues cv(NChannels(), Float(0));
    for (int c = 0; c < NChannels(); ++c)
        cv[c] = BilerpChannel(p, c, wrapMode);
    return cv;
}